

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::ShutdownedWrite::tryRead
          (ShutdownedWrite *this,void *readBufferPtr,size_t minBytes,size_t maxBytes)

{
  int iVar1;
  
  if (_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE == '\0') {
    iVar1 = __cxa_guard_acquire(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
    if (iVar1 != 0) {
      kj::_::ImmediatePromiseNodeBase::ImmediatePromiseNodeBase
                ((ImmediatePromiseNodeBase *)
                 _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
      _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE._0_8_ = &PTR_destroy_006da750;
      __cxa_atexit(kj::_::ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase,
                   _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE,&__dso_handle);
      __cxa_guard_release(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
    }
  }
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)_ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* readBufferPtr, size_t minBytes, size_t maxBytes) override {
      return constPromise<size_t, 0>();
    }